

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyByteListFind(char *zSrc,sxu32 nLen,char *zList,sxu32 *pFirstPos)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  sxi32 c;
  char *zEnd;
  char *zPtr;
  char *zIn;
  sxu32 *pFirstPos_local;
  char *zList_local;
  sxu32 nLen_local;
  char *zSrc_local;
  
  pcVar2 = zSrc + nLen;
  zPtr = zSrc;
  while( true ) {
    zEnd = zList;
    if (pcVar2 <= zPtr) {
      return -6;
    }
    while( true ) {
      iVar1 = (int)zSrc;
      if (*zEnd == '\0') break;
      if (*zPtr == *zEnd) {
        if (pFirstPos != (sxu32 *)0x0) {
          *pFirstPos = (int)zPtr - iVar1;
        }
        return 0;
      }
      zEnd = zEnd + 1;
    }
    pcVar3 = zPtr + 1;
    zEnd = zList;
    if (pcVar2 <= pcVar3) {
      return -6;
    }
    for (; *zEnd != '\0'; zEnd = zEnd + 1) {
      if (*pcVar3 == *zEnd) {
        if (pFirstPos != (sxu32 *)0x0) {
          *pFirstPos = (int)pcVar3 - iVar1;
        }
        return 0;
      }
    }
    pcVar3 = zPtr + 2;
    zEnd = zList;
    if (pcVar2 <= pcVar3) break;
    for (; *zEnd != '\0'; zEnd = zEnd + 1) {
      if (*pcVar3 == *zEnd) {
        if (pFirstPos != (sxu32 *)0x0) {
          *pFirstPos = (int)pcVar3 - iVar1;
        }
        return 0;
      }
    }
    pcVar3 = zPtr + 3;
    zEnd = zList;
    if (pcVar2 <= pcVar3) {
      return -6;
    }
    for (; *zEnd != '\0'; zEnd = zEnd + 1) {
      if (*pcVar3 == *zEnd) {
        if (pFirstPos != (sxu32 *)0x0) {
          *pFirstPos = (int)pcVar3 - iVar1;
        }
        return 0;
      }
    }
    zPtr = zPtr + 4;
  }
  return -6;
}

Assistant:

JX9_PRIVATE sxi32 SyByteListFind(const char *zSrc, sxu32 nLen, const char *zList, sxu32 *pFirstPos)
{
	const char *zIn = zSrc;
	const char *zPtr;
	const char *zEnd;
	sxi32 c;
	zEnd = &zSrc[nLen];
	for(;;){
		if( zIn >= zEnd ){ break; }	for(zPtr = zList ; (c = zPtr[0]) != 0 ; zPtr++ ){ if( zIn[0] == c ){ if( pFirstPos ){ *pFirstPos = (sxu32)(zIn - zSrc); } return SXRET_OK; } } zIn++;
		if( zIn >= zEnd ){ break; }	for(zPtr = zList ; (c = zPtr[0]) != 0 ; zPtr++ ){ if( zIn[0] == c ){ if( pFirstPos ){ *pFirstPos = (sxu32)(zIn - zSrc); } return SXRET_OK; } } zIn++;
		if( zIn >= zEnd ){ break; }	for(zPtr = zList ; (c = zPtr[0]) != 0 ; zPtr++ ){ if( zIn[0] == c ){ if( pFirstPos ){ *pFirstPos = (sxu32)(zIn - zSrc); } return SXRET_OK; } } zIn++;
		if( zIn >= zEnd ){ break; }	for(zPtr = zList ; (c = zPtr[0]) != 0 ; zPtr++ ){ if( zIn[0] == c ){ if( pFirstPos ){ *pFirstPos = (sxu32)(zIn - zSrc); } return SXRET_OK; } } zIn++;
	}	
	return SXERR_NOTFOUND; 
}